

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall pybind11::list::append<char_const(&)[2]>(list *this,char (*val) [2])

{
  PyObject *pPVar1;
  PyObject **ppPVar2;
  object local_20;
  char (*local_18) [2];
  char (*val_local) [2];
  list *this_local;
  
  pPVar1 = (this->super_object).super_handle.m_ptr;
  local_18 = val;
  val_local = (char (*) [2])this;
  detail::object_or_cast<const_char_(&)[2],_0>((detail *)&local_20,val);
  ppPVar2 = handle::ptr((handle *)&local_20);
  PyList_Append(pPVar1,*ppPVar2);
  object::~object(&local_20);
  return;
}

Assistant:

void append(T &&val) const {
        PyList_Append(m_ptr, detail::object_or_cast(std::forward<T>(val)).ptr());
    }